

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O1

EC_T_DWORD RasNotifyWrapper(EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  void *pvVar1;
  uint *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  CAtEmLogging *pCVar5;
  uint uVar6;
  EC_T_DWORD EVar7;
  char *pcVar8;
  uint uVar9;
  
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  uVar4 = (ulong)dwCode;
  pvVar1 = pParms->pCallerData;
  if (pvVar1 == (void *)0x0) {
    return 0x9811000b;
  }
  if (pParms == (EC_T_NOTIFYPARMS *)0x0) {
    return 0x9811000b;
  }
  if ((int)dwCode < 0x110001) {
    if (dwCode == 0x100001) {
      uVar6 = pParms->dwInBufSize;
      if (uVar6 < 8) {
        CAtEmLogging::LogError
                  (*(CAtEmLogging **)((long)pvVar1 + 8),
                   "RAS Invalid Parameter size for ATEMRAS_NOTIFY_CONNECTION");
        EVar7 = 0x9811000b;
      }
      else {
        puVar2 = (uint *)pParms->pbyInBuf;
        uVar9 = *puVar2;
        pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
        if (uVar9 == 0) {
          CAtEmLogging::LogMsg(pCVar5,"RAS Connection changed: Established!\n");
          *(undefined4 *)((long)pvVar1 + 0x7744) = 0;
        }
        else {
          uVar3 = ecatGetText(uVar9);
          CAtEmLogging::LogMsg
                    (pCVar5,"RAS Connection changed: Cause: %s (0x%lx)\n",uVar3,(ulong)*puVar2);
          *(undefined4 *)((long)pvVar1 + 0x7744) = 1;
        }
        EVar7 = 0x98110000;
      }
      if (7 < uVar6) {
        return 0;
      }
      return EVar7;
    }
    if (dwCode == 0x100002) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      pcVar8 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_REGISTER\n";
LAB_0014db5c:
      CAtEmLogging::LogError(pCVar5,pcVar8);
      return 0x9811000b;
    }
    if (dwCode == 0x100003) {
      if (0xf < pParms->dwInBufSize) {
        return 0;
      }
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      pcVar8 = "RAS Invalid Parameter size for ATEMRAS_NOTIFY_UNREGISTER";
      goto LAB_0014db5c;
    }
switchD_0014da03_default:
    pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
    uVar3 = ecatGetNotifyText(dwCode);
    pcVar8 = "emRasNotify: name = %s code = 0x%x";
LAB_0014dbdd:
    CAtEmLogging::LogError(pCVar5,pcVar8,uVar3,uVar4);
  }
  else {
    switch(dwCode) {
    case 0x110001:
      if (0xf < pParms->dwInBufSize) {
        puVar2 = (uint *)pParms->pbyInBuf;
        CAtEmLogging::LogError
                  (*(CAtEmLogging **)((long)pvVar1 + 8),"Marshaling error! Cookie: 0x%lx",
                   (ulong)*puVar2);
        pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
        uVar6 = puVar2[3];
        uVar3 = ecatGetText(puVar2[1]);
        CAtEmLogging::LogError
                  (pCVar5,"Command: 0x%lx, Cause: %s (0x%lx)",(ulong)uVar6,uVar3,(ulong)puVar2[1]);
        CAtEmLogging::LogError
                  (*(CAtEmLogging **)((long)pvVar1 + 8),"Protocol Header: 0x%lx",(ulong)puVar2[2]);
        return 0;
      }
      CAtEmLogging::LogError
                (*(CAtEmLogging **)((long)pvVar1 + 8),
                 "Invalid Parameter size for ATEMRAS_NOTIFY_MARSHALERROR");
      return 0x9811000b;
    case 0x110002:
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      uVar3 = ecatGetText(*(uint *)pParms->pbyInBuf);
      uVar4 = (ulong)*(uint *)pParms->pbyInBuf;
      pcVar8 = "Acknowledge error! Error: %s (0x%lx)";
      goto LAB_0014dbdd;
    case 0x110003:
      uVar6 = *(uint *)pParms->pbyInBuf;
      uVar9 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      uVar3 = ecatGetNotifyText(uVar9);
      pcVar8 = "Out of notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    case 0x110004:
      uVar6 = *(uint *)pParms->pbyInBuf;
      uVar9 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      uVar3 = ecatGetNotifyText(uVar9);
      pcVar8 = "Out of non-mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    case 0x110005:
      uVar6 = *(uint *)pParms->pbyInBuf;
      uVar9 = *(uint *)((long)pParms->pbyInBuf + 4);
      pCVar5 = *(CAtEmLogging **)((long)pvVar1 + 8);
      uVar3 = ecatGetNotifyText(uVar9);
      pcVar8 = "Out of mailbox notification memory! %s (0x%08X), cookie 0x%lx.\n";
      break;
    default:
      goto switchD_0014da03_default;
    }
    CAtEmLogging::LogError(pCVar5,pcVar8,uVar3,(ulong)uVar9,(ulong)uVar6);
  }
  return 0;
}

Assistant:

static EC_T_DWORD RasNotifyWrapper(
                            EC_T_DWORD         dwCode, 
                            EC_T_NOTIFYPARMS*  pParms
                            )
{
    EC_T_DWORD                      dwRetVal                = EC_E_NOERROR;
    CEmNotification*                pNotInst                = EC_NULL;
    
    if ((EC_NULL == pParms)||(EC_NULL==pParms->pCallerData))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }
    
    pNotInst = (CEmNotification*)(pParms->pCallerData);
    dwRetVal = pNotInst->emRasNotify(dwCode, pParms);
Exit:
    
    return dwRetVal;
}